

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Fl_Widget_Type.cxx
# Opt level: O1

void load_panel(void)

{
  int iVar1;
  Fl_Widget_Type *pFVar2;
  
  if (the_panel == (Fl_Window *)0x0) {
    return;
  }
  numselected = 0;
  current_widget = (Fl_Widget_Type *)0x0;
  if (Fl_Type::current != (Fl_Type *)0x0) {
    iVar1 = (*Fl_Type::current->_vptr_Fl_Type[0x17])();
    pFVar2 = (Fl_Widget_Type *)Fl_Type::first;
    if (iVar1 != 0) {
      current_widget = (Fl_Widget_Type *)Fl_Type::current;
    }
    for (; pFVar2 != (Fl_Widget_Type *)0x0; pFVar2 = (Fl_Widget_Type *)(pFVar2->super_Fl_Type).next)
    {
      iVar1 = (*(pFVar2->super_Fl_Type)._vptr_Fl_Type[0x17])(pFVar2);
      if (((iVar1 != 0) && ((pFVar2->super_Fl_Type).selected != '\0')) &&
         (numselected = numselected + 1, current_widget == (Fl_Widget_Type *)0x0)) {
        current_widget = pFVar2;
      }
    }
  }
  if (numselected == 0) {
    (*(the_panel->super_Fl_Group).super_Fl_Widget._vptr_Fl_Widget[6])();
    return;
  }
  propagate_load(&the_panel->super_Fl_Group,"LOAD");
  return;
}

Assistant:

static void load_panel() {
  if (!the_panel) return;

  // find all the Fl_Widget subclasses currently selected:
  numselected = 0;
  current_widget = 0;
  if (Fl_Type::current) {
    if (Fl_Type::current->is_widget())
      current_widget=(Fl_Widget_Type*)Fl_Type::current;
    for (Fl_Type *o = Fl_Type::first; o; o = o->next) {
      if (o->is_widget() && o->selected) {
	numselected++;
	if (!current_widget) current_widget = (Fl_Widget_Type*)o;
      }
    }
  }
  if (numselected)
    propagate_load(the_panel, LOAD);
  else
    the_panel->hide();
}